

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::init
          (InterInvocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *__x;
  pointer *ppiVar1;
  int iVar2;
  int iVar3;
  RenderContext *renderCtx;
  pointer piVar4;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  TestError *this_01;
  NotSupportedError *this_02;
  long lVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroBuffer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  vector<int,_std::allocator<int>_> zeroBuffer_1;
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((((!bVar6) && (this->m_useAtomic != false)) && (this->m_storage == STORAGE_IMAGE)) &&
     (bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_shader_image_atomic"), !bVar6)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&zeroBuffer_1,"Test requires GL_OES_shader_image_atomic extension","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)&zeroBuffer_1);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&zeroBuffer_1,0,0xac);
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_1d0,this);
  __x = &zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
  zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 5;
  zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)__x,local_1d0,local_1c8 + (long)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&zeroBuffer_1 +
                 (uint)zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start),(value_type *)__x);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)&zeroBuffer_1);
  this->m_program = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish != &local_1e0) {
    operator_delete(zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish,local_1e0._M_allocated_capacity + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&zeroBuffer_1,"could not build program","");
    tcu::TestError::TestError(this_01,(string *)&zeroBuffer_1);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_storage == STORAGE_IMAGE) {
    iVar7 = this->m_workWidth;
    iVar2 = this->m_workHeight;
    iVar3 = this->m_elementsPerInvocation;
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Allocating image for storage, size ",0x23);
    std::ostream::operator<<(ppiVar1,this->m_workWidth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1,"x",1);
    std::ostream::operator<<(ppiVar1,this->m_elementsPerInvocation * this->m_workHeight);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1,", ",2);
    std::ostream::operator<<(ppiVar1,iVar7 * iVar2 * iVar3 * 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1," bytes.",7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar9 + 0x6f8))(1,&this->m_storageTex);
    (**(code **)(lVar9 + 0xb8))(0xde1,this->m_storageTex);
    (**(code **)(lVar9 + 0x1380))
              (0xde1,1,0x8235,this->m_workWidth,this->m_elementsPerInvocation * this->m_workHeight);
    (**(code **)(lVar9 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar9 + 0x1360))(0xde1,0x2800,0x2600);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"gen storage image",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0xf8);
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Filling image with 0.",0x15);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
    std::ios_base::~ios_base(local_138);
    zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&zeroBuffer_1,
               (long)(this->m_workHeight * this->m_workWidth * this->m_elementsPerInvocation),
               (value_type_conflict1 *)&zeroBuffer,(allocator_type *)&local_1d0);
    (**(code **)(lVar9 + 0x13b8))
              (0xde1,0,0,0,this->m_workWidth,this->m_elementsPerInvocation * this->m_workHeight,
               0x8d94,0x1404,
               zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"specify image contents",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x100);
    piVar4 = zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    if (this->m_storage != STORAGE_BUFFER) goto LAB_014bb335;
    iVar7 = this->m_workHeight * this->m_workWidth * this->m_elementsPerInvocation;
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&zeroBuffer,(long)iVar7,(value_type_conflict4 *)&zeroBuffer_1,
               (allocator_type *)&local_1d0);
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Allocating zero-filled buffer for storage, size ",0x30);
    std::ostream::operator<<(ppiVar1,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1," elements, ",0xb);
    std::ostream::operator<<(ppiVar1,iVar7 * 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1," bytes.",7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar9 + 0x6c8))(1,&this->m_storageBuf);
    (**(code **)(lVar9 + 0x40))(0x90d2,this->m_storageBuf);
    (**(code **)(lVar9 + 0x150))
              (0x90d2,(long)(iVar7 * 4),
               CONCAT44(zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (uint)zeroBuffer.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start),0x88e4);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"gen storage buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0xea);
    piVar4 = (pointer)CONCAT44(zeroBuffer.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)zeroBuffer.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
  }
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
LAB_014bb335:
  iVar7 = this->m_workHeight * this->m_workWidth;
  zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&zeroBuffer,(long)iVar7,
             (value_type_conflict1 *)&zeroBuffer_1,(allocator_type *)&local_1d0);
  zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppiVar1,"Allocating -1 filled buffer for results, size ",0x2e);
  std::ostream::operator<<(ppiVar1,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1," elements, ",0xb);
  std::ostream::operator<<(ppiVar1,iVar7 * 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppiVar1," bytes.",7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar9 + 0x6c8))(1,&this->m_resultBuf);
  (**(code **)(lVar9 + 0x40))(0x90d2,this->m_resultBuf);
  (**(code **)(lVar9 + 0x150))
            (0x90d2,(long)(iVar7 * 4),
             CONCAT44(zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)zeroBuffer.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start),0x88e4);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"gen storage buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x112);
  pvVar5 = (void *)CONCAT44(zeroBuffer.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)zeroBuffer.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  iVar7 = extraout_EAX;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)zeroBuffer.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
    iVar7 = extraout_EAX_00;
  }
  return iVar7;
}

Assistant:

void InterInvocationTestCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// program

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genShaderSource()));
	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		throw tcu::TestError("could not build program");

	// source

	if (m_storage == STORAGE_BUFFER)
	{
		const int				bufferElements	= m_workWidth * m_workHeight * m_elementsPerInvocation;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);
		std::vector<deUint32>	zeroBuffer		(bufferElements, 0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating zero-filled buffer for storage, size " << bufferElements << " elements, " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_storageBuf);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_storageBuf);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage buf");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		const int				bufferElements	= m_workWidth * m_workHeight * m_elementsPerInvocation;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating image for storage, size " << m_workWidth << "x" << m_workHeight * m_elementsPerInvocation << ", " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genTextures(1, &m_storageTex);
		gl.bindTexture(GL_TEXTURE_2D, m_storageTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32I, m_workWidth, m_workHeight * m_elementsPerInvocation);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage image");

		// Zero-fill
		m_testCtx.getLog() << tcu::TestLog::Message << "Filling image with 0." << tcu::TestLog::EndMessage;

		{
			const std::vector<deInt32> zeroBuffer(m_workWidth * m_workHeight * m_elementsPerInvocation, 0);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, m_workWidth, m_workHeight * m_elementsPerInvocation, GL_RED_INTEGER, GL_INT, &zeroBuffer[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "specify image contents");
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	// destination

	{
		const int				bufferElements	= m_workWidth * m_workHeight;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);
		std::vector<deInt32>	negativeBuffer	(bufferElements, -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating -1 filled buffer for results, size " << bufferElements << " elements, " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_resultBuf);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_resultBuf);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &negativeBuffer[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage buf");
	}
}